

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

Dataset * __thiscall
notch::io::IDXReader::readDataset
          (Dataset *__return_storage_ptr__,IDXReader *this,istream *in,size_t *dims,size_t *shape)

{
  uint32_t uVar1;
  size_t sVar2;
  runtime_error *this_00;
  ulong uVar3;
  size_type sVar4;
  size_t sVar5;
  size_type sVar6;
  size_type __n;
  Array sample;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator_type local_61;
  Dataset *local_60;
  value_type local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = __return_storage_ptr__;
  sVar2 = readDims(this,in);
  *dims = sVar2;
  if (sVar2 == 0) {
    sVar2 = *shape;
    __n = 1;
  }
  else {
    sVar5 = 0;
    do {
      uVar1 = readBigEndian(this,in);
      shape[sVar5] = (ulong)uVar1;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
    sVar2 = *shape;
    __n = 1;
    if (1 < *dims) {
      uVar3 = 1;
      do {
        __n = __n * shape[uVar3];
        uVar3 = uVar3 + 1;
      } while (*dims != uVar3);
    }
  }
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::reserve
            (local_60,sVar2);
  local_58._M_size = local_58._M_size & 0xffffffffffffff00;
  core::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,__n,(value_type_conflict1 *)&local_58,&local_61);
  if (sVar2 != 0) {
    sVar6 = 0;
    do {
      local_58._M_size = __n;
      local_58._M_data = (float *)operator_new(__n * 4);
      if (__n != 0) {
        memset(local_58._M_data,0,__n * 4);
      }
      std::istream::read((char *)in,
                         (long)local_48.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      if (*(size_type *)(in + 8) != __n) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"IDXReader: cannot read data sample");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (__n != 0) {
        sVar4 = 0;
        do {
          local_58._M_data[sVar4] =
               (float)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[sVar4];
          sVar4 = sVar4 + 1;
        } while (__n != sVar4);
      }
      core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
                (local_60,&local_58);
      operator_delete(local_58._M_data);
      sVar6 = sVar6 + 1;
    } while (sVar6 != sVar2);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return local_60;
}

Assistant:

Dataset readDataset(std::istream &in, size_t *dims, size_t shape[]) {
        Dataset dataset;
        // read shape information
        *dims = readDims(in);
        readShape(in, *dims, shape);
        // calculate sample size in bytes
        size_t nSamples = shape[0];
        size_t nSampleSize = sizeof(uint8_t);
        for (size_t i = 1; i < *dims; ++i) {
            nSampleSize *= shape[i];
        }
        // read all samples
        dataset.reserve(nSamples);
        std::vector<uint8_t> buf(nSampleSize, 0);
        for (size_t i = 0; i < nSamples; ++i) {
            Array sample(0.0, nSampleSize);
            in.read((char*)buf.data(), nSampleSize);
            size_t n = in.gcount();
            if (n != nSampleSize) {
                throw std::runtime_error("IDXReader: cannot read data sample");
            }
            for (size_t j = 0; j < nSampleSize; ++j) {
                sample[j] = buf[j]; // convert uint8_t to float
            }
            dataset.push_back(sample);
        }
        return dataset;
    }